

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateSGD(ValidationContext *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  pointer puVar6;
  uint *puVar7;
  ValidationContext *this_00;
  IssueError *pIVar8;
  _khr_df_model_e *p_Var9;
  ValidationContext *this_01;
  ktx_uint8_t *pkVar10;
  reference pvVar11;
  uint uVar12;
  long *in_RDI;
  ktxBasisLzEtc1sImageDesc *image;
  uint32_t imageIndex;
  uint32_t zSlice;
  uint32_t face;
  uint32_t layer;
  uint32_t level_1;
  uint32_t i;
  bool foundPFrame;
  ktxBasisLzEtc1sImageDesc *imageDescs;
  uint64_t expectedBgdByteLength;
  ktxBasisLzGlobalHeader *bgh;
  uint32_t level;
  uint32_t imageCount;
  __array buffer;
  ktx_uint64_t sgdByteLength;
  ktx_uint64_t sgdByteOffset;
  uint *in_stack_00000128;
  unsigned_long *in_stack_00000130;
  ktx_uint32_t *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  uint uVar13;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint uVar14;
  uint in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar15;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar16;
  uint in_stack_ffffffffffffff94;
  ValidationContext *in_stack_ffffffffffffff98;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined4 local_40;
  undefined8 local_30;
  undefined8 local_28;
  IssueError *local_18;
  long local_10;
  
  local_10 = in_RDI[0xf];
  local_18 = (IssueError *)in_RDI[0x10];
  if ((local_10 != 0) && (local_18 != (IssueError *)0x0)) {
    std::make_unique<unsigned_char[]>(in_stack_fffffffffffffef8);
    lVar3 = local_10;
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_fffffffffffffee0);
    pIVar8 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    (**(code **)(*in_RDI + 0x10))(in_RDI,lVar3,puVar6,pIVar8,local_30,local_28);
    if (*(int *)((long)in_RDI + 100) == 1) {
      local_44 = 0;
      for (local_48 = 0; local_48 < *(uint *)((long)in_RDI + 0x8c); local_48 = local_48 + 1) {
        lVar3 = in_RDI[0x11];
        iVar1 = *(int *)((long)in_RDI + 0x5c);
        local_4c = *(uint *)((long)in_RDI + 0x54) >> ((byte)local_48 & 0x1f);
        local_50 = 1;
        puVar7 = std::max<unsigned_int>(&local_4c,&local_50);
        local_44 = (int)lVar3 * iVar1 * *puVar7 + local_44;
      }
      if (local_18 < (IssueError *)0x14) {
        error<unsigned_long_const&>
                  (in_stack_ffffffffffffff98,
                   (IssueError *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (unsigned_long *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_40 = 1;
      }
      else {
        this_00 = (ValidationContext *)
                  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             in_stack_fffffffffffffee0);
        pIVar8 = (IssueError *)
                 ((ulong)local_44 * 0x14 + 0x14 +
                  (ulong)*(uint *)((long)&this_00->_vptr_ValidationContext + 4) +
                  (ulong)*(uint *)&(this_00->callback).super__Function_base._M_functor +
                  (ulong)*(uint *)((long)&(this_00->callback).super__Function_base._M_functor + 4) +
                 (ulong)*(uint *)((long)&(this_00->callback).super__Function_base._M_functor + 8));
        if (local_18 != pIVar8) {
          error<unsigned_long_const&,unsigned_int&,unsigned_long_const&>
                    (in_stack_ffffffffffffff98,
                     (IssueError *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (unsigned_long *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (unsigned_long *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
          ;
        }
        bVar4 = std::optional::operator_cast_to_bool((optional<_khr_df_model_e> *)0x2b475e);
        if (((bVar4) &&
            (p_Var9 = std::optional<_khr_df_model_e>::operator*
                                ((optional<_khr_df_model_e> *)0x2b4778),
            *p_Var9 == KHR_DF_MODEL_ETC1S)) &&
           (*(int *)((long)&(this_00->callback).super__Function_base._M_functor + 8) != 0)) {
          error<unsigned_int_const&>
                    (in_stack_ffffffffffffff98,
                     (IssueError *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (uint *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
        if (local_18 < (IssueError *)((ulong)local_44 * 0x14 + 0x14)) {
          local_40 = 1;
        }
        else {
          puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                             ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              in_stack_fffffffffffffee0);
          this_01 = (ValidationContext *)(puVar6 + 0x14);
          in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff;
          uVar16 = 0;
          for (uVar15 = 0; uVar15 < *(uint *)((long)in_RDI + 0x8c); uVar15 = uVar15 + 1) {
            for (in_stack_ffffffffffffff88 = 0; in_stack_ffffffffffffff88 < *(uint *)(in_RDI + 0x11)
                ; in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1) {
              for (in_stack_ffffffffffffff84 = 0;
                  in_stack_ffffffffffffff84 < *(uint *)((long)in_RDI + 0x5c);
                  in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
                uVar14 = 0;
                while( true ) {
                  uVar5 = *(uint *)((long)in_RDI + 0x54) >> ((byte)uVar15 & 0x1f);
                  uVar13 = 1;
                  in_stack_ffffffffffffff80 = uVar14;
                  puVar7 = std::max<unsigned_int>
                                     ((uint *)&stack0xffffffffffffff7c,
                                      (uint *)&stack0xffffffffffffff78);
                  if (*puVar7 <= uVar14) break;
                  uVar12 = uVar16 + 1;
                  pkVar10 = (this_01->header).identifier + (ulong)uVar16 * 0x14 + -0x38;
                  if ((*(uint *)pkVar10 & 2) != 0) {
                    in_stack_ffffffffffffff94 = CONCAT13(1,(int3)in_stack_ffffffffffffff94);
                  }
                  if ((*(uint *)pkVar10 & 0xfffffffd) != 0) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              (this_01,(IssueError *)CONCAT44(in_stack_ffffffffffffff94,uVar12),
                               (uint *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                               (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,(uint *)CONCAT44(uVar5,uVar13),
                               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff70),(uint *)bgh);
                  }
                  if (*(uint *)(pkVar10 + 8) == 0) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              (this_01,(IssueError *)CONCAT44(in_stack_ffffffffffffff94,uVar12),
                               (uint *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                               (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,(uint *)CONCAT44(uVar5,uVar13),
                               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff70),(uint *)bgh);
                  }
                  uVar14 = *(uint *)(pkVar10 + 4);
                  uVar2 = *(uint *)(pkVar10 + 8);
                  pvVar11 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::
                            operator[]((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                                        *)(in_RDI + 0x13),(ulong)uVar15);
                  if (pvVar11->byteLength < (ulong)(uVar14 + uVar2)) {
                    in_stack_fffffffffffffee0 = (ktx_uint32_t *)(pkVar10 + 8);
                    std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                              ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                               (in_RDI + 0x13),(ulong)uVar15);
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                              (this_00,pIVar8,(uint *)this_01,
                               (uint *)CONCAT44(in_stack_ffffffffffffff94,uVar12),
                               (uint *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                               (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,(uint *)this,in_stack_00000128,in_stack_00000130);
                  }
                  uVar14 = *(uint *)(pkVar10 + 0xc);
                  uVar2 = *(uint *)(pkVar10 + 0x10);
                  pvVar11 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::
                            operator[]((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                                        *)(in_RDI + 0x13),(ulong)uVar15);
                  if (pvVar11->byteLength < (ulong)(uVar14 + uVar2)) {
                    in_stack_fffffffffffffee0 = (ktx_uint32_t *)(pkVar10 + 0x10);
                    std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::operator[]
                              ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                               (in_RDI + 0x13),(ulong)uVar15);
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                              (this_00,pIVar8,(uint *)this_01,
                               (uint *)CONCAT44(in_stack_ffffffffffffff94,uVar12),
                               (uint *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                               (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,(uint *)this,in_stack_00000128,in_stack_00000130);
                  }
                  if ((*(uint *)(pkVar10 + 0x10) == 0) && (*(int *)((long)in_RDI + 0x94) == 2)) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&>
                              (this_01,(IssueError *)CONCAT44(in_stack_ffffffffffffff94,uVar12),
                               (uint *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                               (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,(uint *)CONCAT44(uVar5,uVar13),
                               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff70));
                  }
                  if ((*(uint *)(pkVar10 + 0x10) != 0) && (*(int *)((long)in_RDI + 0x94) == 1)) {
                    error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              (this_01,(IssueError *)CONCAT44(in_stack_ffffffffffffff94,uVar12),
                               (uint *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                               (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,(uint *)CONCAT44(uVar5,uVar13),
                               (uint *)CONCAT44(uVar16,in_stack_ffffffffffffff70),(uint *)bgh);
                  }
                  uVar14 = in_stack_ffffffffffffff80 + 1;
                  uVar16 = uVar12;
                }
              }
            }
          }
          if (((in_stack_ffffffffffffff94 & 0x1000000) != 0) &&
             ((*(byte *)(in_RDI + 0x22) & 1) == 0)) {
            error<>((ValidationContext *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                    (IssueError *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          }
          local_40 = 0;
        }
      }
    }
    else {
      local_40 = 1;
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void ValidationContext::validateSGD() {
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    if (sgdByteOffset == 0 || sgdByteLength == 0)
        return; // There is no SGD block

    const auto buffer = std::make_unique<uint8_t[]>(sgdByteLength);
    read(sgdByteOffset, buffer.get(), sgdByteLength, "the SGD");

    if (header.supercompressionScheme != KTX_SS_BASIS_LZ)
        return;

    // Validate BASIS_LZ SGD

    uint32_t imageCount = 0;
    // uint32_t layersFaces = numLayers * header.faceCount;
    for (uint32_t level = 0; level < numLevels; ++level)
        // numFaces * depth is only reasonable because they can't both be > 1. There are no 3D cubemaps
        imageCount += numLayers * header.faceCount * std::max(header.pixelDepth >> level, 1u);

    // Validate GlobalHeader
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader)) {
        error(SGD::BLZESizeTooSmallHeader, sgdByteLength);
        return;
    }

    const ktxBasisLzGlobalHeader& bgh = *reinterpret_cast<const ktxBasisLzGlobalHeader*>(buffer.get());

    const uint64_t expectedBgdByteLength =
            sizeof(ktxBasisLzGlobalHeader) +
            sizeof(ktxBasisLzEtc1sImageDesc) * imageCount +
            bgh.endpointsByteLength +
            bgh.selectorsByteLength +
            bgh.tablesByteLength +
            bgh.extendedByteLength;
    if (sgdByteLength != expectedBgdByteLength)
        error(SGD::BLZESizeIncorrect, sgdByteLength, imageCount, expectedBgdByteLength);

    if (parsedColorModel && *parsedColorModel == KHR_DF_MODEL_ETC1S && bgh.extendedByteLength != 0)
        error(SGD::BLZEExtendedByteLengthNotZero, bgh.extendedByteLength);

    // Validate ImageDesc
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader) + sizeof(ktxBasisLzEtc1sImageDesc) * imageCount)
        return;

    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(buffer.get());

    bool foundPFrame = false;
    uint32_t i = 0;
    for (uint32_t level = 0; level < numLevels; ++level) {
        for (uint32_t layer = 0; layer < numLayers; ++layer) {
            for (uint32_t face = 0; face < header.faceCount; ++face) {
                for (uint32_t zSlice = 0; zSlice < std::max(header.pixelDepth >> level, 1u); ++zSlice) {
                    const auto imageIndex = i++;
                    const auto& image = imageDescs[imageIndex];

                    if (image.imageFlags & ETC1S_P_FRAME)
                        foundPFrame = true;

                    if (image.imageFlags & ~ETC1S_P_FRAME)
                        error(SGD::BLZEInvalidImageFlagBit, level, layer, face, zSlice, image.imageFlags);

                    if (image.rgbSliceByteLength == 0)
                        error(SGD::BLZEZeroRGBLength, level, layer, face, zSlice, image.rgbSliceByteLength);

                    if (image.rgbSliceByteOffset + image.rgbSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidRGBSlice, level, layer, face, zSlice, image.rgbSliceByteOffset, image.rgbSliceByteLength, levelIndices[level].byteLength);
                    if (image.alphaSliceByteOffset + image.alphaSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidAlphaSlice, level, layer, face, zSlice, image.alphaSliceByteOffset, image.alphaSliceByteLength, levelIndices[level].byteLength);

                    // Crosscheck with the DFD numSamples
                    if (image.alphaSliceByteLength == 0 && numSamples == 2)
                        error(SGD::BLZEDFDMismatchAlpha, level, layer, face, zSlice);
                    if (image.alphaSliceByteLength != 0 && numSamples == 1)
                        error(SGD::BLZEDFDMismatchNoAlpha, level, layer, face, zSlice, image.alphaSliceByteLength);
                }
            }
        }
    }

    if (foundPFrame)
        if (!foundKTXanimData)
            error(SGD::BLZENoAnimationSequencesPFrame);
}